

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O2

Mesh * vera::gridMesh(Mesh *__return_storage_ptr__,float _width,float _height,int _columns,int _rows
                     ,float _y)

{
  int iy;
  int iVar1;
  vec<3,_float,_(glm::qualifier)0> vVar2;
  vec3 B;
  vec3 A;
  vec3 local_138;
  vec3 local_128;
  float local_118;
  float local_108;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_f0;
  float local_ec;
  float local_e8;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_e4;
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  
  local_118 = _width;
  local_108 = _height;
  Mesh::Mesh(__return_storage_ptr__);
  __return_storage_ptr__->m_drawMode = LINES;
  local_e4.x = local_118 * 0.5;
  local_dc = local_108 * 0.5;
  local_f0.x = -local_e4.x;
  local_e8 = -local_dc;
  local_118 = (float)_rows + -1.0;
  local_ec = _y;
  local_e0 = _y;
  for (iVar1 = 0; _rows != iVar1; iVar1 = iVar1 + 1) {
    local_d8 = 0.0;
    local_108 = (float)iVar1 / local_118;
    local_d4 = _y;
    local_d0 = local_108;
    vVar2 = glm::detail::compute_mix_vector<3,_float,_float,_(glm::qualifier)0,_false>::call
                      ((vec<3,_float,_(glm::qualifier)0> *)&local_e4,
                       (vec<3,_float,_(glm::qualifier)0> *)&local_f0,
                       (vec<3,_float,_(glm::qualifier)0> *)&local_d8);
    local_128.field_2 = vVar2.field_2;
    local_128._0_8_ = vVar2._0_8_;
    local_d8 = 1.0;
    local_d0 = local_108;
    local_d4 = _y;
    vVar2 = glm::detail::compute_mix_vector<3,_float,_float,_(glm::qualifier)0,_false>::call
                      ((vec<3,_float,_(glm::qualifier)0> *)&local_e4,
                       (vec<3,_float,_(glm::qualifier)0> *)&local_f0,
                       (vec<3,_float,_(glm::qualifier)0> *)&local_d8);
    local_138.field_2 = vVar2.field_2;
    local_138._0_8_ = vVar2._0_8_;
    lineMesh((Mesh *)&local_d8,&local_128,&local_138);
    Mesh::append(__return_storage_ptr__,(Mesh *)&local_d8);
    Mesh::~Mesh((Mesh *)&local_d8);
  }
  local_118 = (float)_columns + -1.0;
  for (iVar1 = 0; _columns != iVar1; iVar1 = iVar1 + 1) {
    local_108 = (float)iVar1 / local_118;
    local_d0 = 0.0;
    local_d8 = local_108;
    local_d4 = _y;
    vVar2 = glm::detail::compute_mix_vector<3,_float,_float,_(glm::qualifier)0,_false>::call
                      ((vec<3,_float,_(glm::qualifier)0> *)&local_e4,
                       (vec<3,_float,_(glm::qualifier)0> *)&local_f0,
                       (vec<3,_float,_(glm::qualifier)0> *)&local_d8);
    local_128.field_2 = vVar2.field_2;
    local_128._0_8_ = vVar2._0_8_;
    local_d8 = local_108;
    local_d0 = 1.0;
    local_d4 = _y;
    vVar2 = glm::detail::compute_mix_vector<3,_float,_float,_(glm::qualifier)0,_false>::call
                      ((vec<3,_float,_(glm::qualifier)0> *)&local_e4,
                       (vec<3,_float,_(glm::qualifier)0> *)&local_f0,
                       (vec<3,_float,_(glm::qualifier)0> *)&local_d8);
    local_138.field_2 = vVar2.field_2;
    local_138._0_8_ = vVar2._0_8_;
    lineMesh((Mesh *)&local_d8,&local_128,&local_138);
    Mesh::append(__return_storage_ptr__,(Mesh *)&local_d8);
    Mesh::~Mesh((Mesh *)&local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

Mesh gridMesh(float _width, float _height, int _columns, int _rows, float _y) {
    Mesh mesh;
    mesh.setDrawMode(LINES);

    // the origin of the plane is at the center //
    float halfW = _width  * 0.5f;
    float halfH = _height * 0.5f;

    //  . --- A
    //  |     |
    //  B --- .

    glm::vec3 A = glm::vec3(halfW, _y, halfH);
    glm::vec3 B = glm::vec3(-halfW, _y, -halfH);

    // add the vertexes //
    for(int iy = 0; iy != _rows; iy++) {
        float pct = ((float)iy/((float)_rows-1));

        glm::vec3 left = glm::mix(A, B, glm::vec3(0.0, _y, pct));
        glm::vec3 right = glm::mix(A, B, glm::vec3(1.0, _y, pct));

        mesh.append( lineMesh(left, right) );
    }

    for(int ix = 0; ix != _columns; ix++) {
        float pct = ((float)ix/((float)_columns-1));

        glm::vec3 top = glm::mix(A, B, glm::vec3(pct, _y, 0.0));
        glm::vec3 down = glm::mix(A, B, glm::vec3(pct, _y, 1.0));

        mesh.append( lineMesh(top, down) );
    }

    return mesh;
}